

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8Utils.c
# Opt level: O1

int XConvertUtf8ToUcs(uchar *buf,int len,uint *ucs)

{
  byte bVar1;
  int iVar2;
  uint uVar3;
  
  bVar1 = *buf;
  uVar3 = (uint)bVar1;
  if ((char)bVar1 < '\0') {
    if ((bVar1 & 0x40) != 0) {
      if ((bVar1 & 0x20) == 0) {
        if (((1 < len) && ((buf[1] & 0xffffffc0) == 0x80)) &&
           (uVar3 = (uVar3 & 0x1f) << 6, *ucs = buf[1] & 0x3f | uVar3, 0x7f < uVar3)) {
          return 2;
        }
      }
      else if ((bVar1 & 0x10) == 0) {
        if ((((2 < len) && ((buf[1] & 0xc0) == 0x80)) && ((buf[2] & 0xffffffc0) == 0x80)) &&
           (uVar3 = (buf[1] & 0x3f) << 6 | (uVar3 & 0xf) << 0xc, *ucs = buf[2] & 0x3f | uVar3,
           0x7ff < uVar3)) {
          return 3;
        }
      }
      else if ((bVar1 & 8) == 0) {
        if (((3 < len) && ((buf[1] & 0xc0) == 0x80)) &&
           (((buf[2] & 0xffffffc0) == 0x80 &&
            (((buf[3] & 0xffffffc0) == 0x80 &&
             (uVar3 = (buf[1] & 0x3f) << 0xc | (uVar3 & 7) << 0x12,
             *ucs = buf[3] & 0x3f | (buf[2] & 0x3f) << 6 | uVar3, 0xffff < uVar3)))))) {
          return 4;
        }
      }
      else if ((((4 < len && (char)((bVar1 & 4) >> 2) == '\0') && ((buf[1] & 0xc0) == 0x80)) &&
               ((buf[2] & 0xffffffc0) == 0x80)) &&
              (((buf[3] & 0xffffffc0) == 0x80 && ((buf[4] & 0xffffffc0) == 0x80)))) {
        uVar3 = (buf[1] & 0x3f) << 0x12 | (uVar3 & 3) << 0x18;
        *ucs = buf[4] & 0x3f | (buf[3] & 0x3f) << 6 | (buf[2] & 0x3f) << 0xc | uVar3;
        if (((bVar1 & 3) == 0) && (0x1fffff < uVar3)) {
          return 5;
        }
      }
    }
  }
  else {
    iVar2 = 1;
    if (0 < len) goto LAB_0020a0b5;
  }
  iVar2 = -1;
  uVar3 = 0x3f;
LAB_0020a0b5:
  *ucs = uVar3;
  return iVar2;
}

Assistant:

int
XConvertUtf8ToUcs(const unsigned char     *buf,
		  int                     len,
		  unsigned int         	  *ucs) {

  if (buf[0] & 0x80) {
    if (buf[0] & 0x40) {
      if (buf[0] & 0x20) {
	if (buf[0] & 0x10) {
	  if (buf[0] & 0x08) {
	    if (buf[0] & 0x04) {
	      if (buf[0] & 0x02) {
		/* bad UTF-8 string */
	      } else {
		/* 0x04000000 - 0x7FFFFFFF */
	      }	
	    } else if (len > 4 
		       && (buf[1] & 0xC0) == 0x80
		       && (buf[2] & 0xC0) == 0x80
		       && (buf[3] & 0xC0) == 0x80
		       && (buf[4] & 0xC0) == 0x80) {
	      /* 0x00200000 - 0x03FFFFFF */
	      *ucs =  ((buf[0] & ~0xF8) << 24) +
		      ((buf[1] & ~0x80) << 18) +
		      ((buf[2] & ~0x80) << 12) +
		      ((buf[3] & ~0x80) << 6) +
		       (buf[4] & ~0x80);
	      if (*ucs > 0x001FFFFF && *ucs < 0x01000000) return 5;
	    }
	  } else if (len > 3 
		     && (buf[1] & 0xC0) == 0x80
		     && (buf[2] & 0xC0) == 0x80
		     && (buf[3] & 0xC0) == 0x80) {
	    /* 0x00010000 - 0x001FFFFF */
	    *ucs =  ((buf[0] & ~0xF0) << 18) +
		    ((buf[1] & ~0x80) << 12) +
		    ((buf[2] & ~0x80) << 6) +
		     (buf[3] & ~0x80);
	    if (*ucs > 0x0000FFFF) return 4;
	  }
	} else if (len > 2
	           && (buf[1] & 0xC0) == 0x80 
		   && (buf[2] & 0xC0) == 0x80) {
	  /* 0x00000800 - 0x0000FFFF */
	  *ucs =  ((buf[0] & ~0xE0) << 12) +
		  ((buf[1] & ~0x80) << 6) +
		   (buf[2] & ~0x80);
	  if (*ucs > 0x000007FF) return 3;
	}	
      } else if (len > 1 && (buf[1] & 0xC0) == 0x80) {
	/* 0x00000080 - 0x000007FF */
	*ucs = ((buf[0] & ~0xC0) << 6) +
		(buf[1] & ~0x80);
	if (*ucs > 0x0000007F) return 2;
      }
    }
  } else if (len > 0) {
    /* 0x00000000 - 0x0000007F */
    *ucs = buf[0];
    return 1;
  } 

  *ucs = (unsigned int) '?'; /* bad utf-8 string */
  return -1;
}